

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteObjectProperties<Js::ObjectPropertyEnumerator>
          (SerializationCloner<Js::StreamWriter> *this,ObjectPropertyEnumerator *enumerator)

{
  bool bVar1;
  charcount_t len;
  char16 *str;
  Engine *this_00;
  Var src;
  uint local_1c;
  ObjectPropertyEnumerator *local_18;
  ObjectPropertyEnumerator *enumerator_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  local_18 = enumerator;
  enumerator_local = (ObjectPropertyEnumerator *)this;
  while( true ) {
    bVar1 = ObjectPropertyEnumerator::MoveNext(local_18);
    if (!bVar1) break;
    str = ObjectPropertyEnumerator::GetNameString(local_18);
    len = ObjectPropertyEnumerator::GetNameLength(local_18);
    Write(this,str,len);
    this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    src = ObjectPropertyEnumerator::GetValue(local_18);
    SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone(this_00,src);
  }
  local_1c = 0xffffffff;
  StreamWriter::Write<unsigned_int>(this->m_writer,&local_1c);
  return;
}

Assistant:

void WriteObjectProperties(Enumerator* enumerator)
        {
            while (enumerator->MoveNext())
            {
                // Write property name
                Write(enumerator->GetNameString(), enumerator->GetNameLength());

                // Write property value
                this->GetEngine()->Clone(enumerator->GetValue());
            }

            // Write property terminator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }